

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void on_loss_detected(quicly_loss_t *loss,quicly_sent_packet_t *lost_packet,int is_time_threshold)

{
  quicly_sent_t **ppqVar1;
  quicly_sent_t *pqVar2;
  
  ppqVar1 = &loss[-5].sentmap._pending_packet;
  *ppqVar1 = (quicly_sent_t *)((long)&(*ppqVar1)->acked + 1);
  if (is_time_threshold != 0) {
    loss[-4].conf = (quicly_loss_conf_t *)((long)&(loss[-4].conf)->time_reordering_percentile + 1);
  }
  (**(code **)(loss[2].total_bytes_sent + 0x18))
            (&loss[2].total_bytes_sent,loss,lost_packet->cc_bytes_in_flight,
             lost_packet->packet_number,loss[1].conf,loss[6].sentmap.head,
             *(undefined2 *)&loss[1].ack_delay_exponent);
  pqVar2 = loss[-2].sentmap._pending_packet;
  if (pqVar2 != (quicly_sent_t *)0x0) {
    (*(code *)pqVar2)(loss[-1].conf,
                      "{\"type\":\"packet-lost\", \"time\":%lld, \"pn\":%llu, \"packet-type\":%llu}\n"
                      ,loss[6].sentmap.head,lost_packet->packet_number,lost_packet->ack_epoch);
    pqVar2 = loss[-2].sentmap._pending_packet;
    if (pqVar2 != (quicly_sent_t *)0x0) {
      (*(code *)pqVar2)(loss[-1].conf,
                        "{\"type\":\"cc-congestion\", \"time\":%lld, \"max-lost-pn\":%llu, \"inflight\":%llu, \"cwnd\":%llu}\n"
                        ,loss[6].sentmap.head,lost_packet->packet_number + 1,
                        (loss->sentmap).bytes_in_flight,(int)loss[2].loss_time);
      pqVar2 = loss[-2].sentmap._pending_packet;
      if (pqVar2 != (quicly_sent_t *)0x0) {
        (*(code *)pqVar2)(loss[-1].conf,
                          "{\"type\":\"quictrace-cc-lost\", \"time\":%lld, \"min-rtt\":%u, \"smoothed-rtt\":%u, \"latest-rtt\":%u, \"cwnd\":%llu, \"inflight\":%llu}\n"
                          ,loss[6].sentmap.head,(loss->rtt).minimum,(loss->rtt).smoothed,
                          (loss->rtt).latest,(int)loss[2].loss_time,(loss->sentmap).bytes_in_flight)
        ;
      }
    }
  }
  return;
}

Assistant:

static void on_loss_detected(quicly_loss_t *loss, const quicly_sent_packet_t *lost_packet, int is_time_threshold)
{
    quicly_conn_t *conn = (void *)((char *)loss - offsetof(quicly_conn_t, egress.loss));

    ++conn->super.stats.num_packets.lost;
    if (is_time_threshold)
        ++conn->super.stats.num_packets.lost_time_threshold;
    conn->egress.cc.type->cc_on_lost(&conn->egress.cc, &conn->egress.loss, lost_packet->cc_bytes_in_flight,
                                     lost_packet->packet_number, conn->egress.packet_number, conn->stash.now,
                                     conn->egress.max_udp_payload_size);
    QUICLY_PROBE(PACKET_LOST, conn, conn->stash.now, lost_packet->packet_number, lost_packet->ack_epoch);
    QUICLY_PROBE(CC_CONGESTION, conn, conn->stash.now, lost_packet->packet_number + 1, conn->egress.loss.sentmap.bytes_in_flight,
                 conn->egress.cc.cwnd);
    QUICLY_PROBE(QUICTRACE_CC_LOST, conn, conn->stash.now, &conn->egress.loss.rtt, conn->egress.cc.cwnd,
                 conn->egress.loss.sentmap.bytes_in_flight);
}